

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTestPackage.cpp
# Opt level: O2

IterateResult __thiscall vkt::TestCaseExecutor::iterate(TestCaseExecutor *this,TestCase *param_1)

{
  TestStatus result;
  
  (*this->m_instance->_vptr_TestInstance[2])(&result);
  if (result.m_code != QP_TEST_RESULT_LAST) {
    tcu::TestContext::setTestResult
              ((this->m_context).m_testCtx,result.m_code,result.m_description._M_dataplus._M_p);
  }
  std::__cxx11::string::~string((string *)&result.m_description);
  return (uint)(result.m_code == QP_TEST_RESULT_LAST);
}

Assistant:

tcu::TestNode::IterateResult TestCaseExecutor::iterate (tcu::TestCase*)
{
	DE_ASSERT(m_instance);

	const tcu::TestStatus	result	= m_instance->iterate();

	if (result.isComplete())
	{
		// Vulkan tests shouldn't set result directly
		DE_ASSERT(m_context.getTestContext().getTestResult() == QP_TEST_RESULT_LAST);
		m_context.getTestContext().setTestResult(result.getCode(), result.getDescription().c_str());
		return tcu::TestNode::STOP;
	}
	else
		return tcu::TestNode::CONTINUE;
}